

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr input)

{
  uint uVar1;
  SourceFile *pSVar2;
  ElementCount index;
  uint uVar3;
  uint uVar4;
  ListReader **ppLVar5;
  Builder result;
  Reader expression;
  char *pcVar6;
  undefined8 uVar7;
  byte bVar8;
  long lVar9;
  StructSchema SVar10;
  ListReader **ppLVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t startByte;
  size_t sVar14;
  bool bVar15;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  CliArgumentErrorReporter errorReporter;
  ParserInput parserInput;
  Fault f_1;
  NullableValue<capnp::Type> _type1252;
  Builder lexedTokens;
  Reader tokens;
  CapnpParser parser;
  MallocMessageBuilder tokenArena;
  ErrorReporter local_568;
  bool local_560;
  char *local_558;
  size_t sStack_550;
  ArrayDisposer *local_548;
  long local_540;
  ListReader *local_538;
  uint local_530;
  ListReader *local_528;
  ElementCount local_520;
  ListReader *local_518;
  uint local_510;
  undefined1 local_508 [8];
  CompiledType CStack_500;
  char local_440;
  OrphanBuilder local_438;
  undefined1 local_418 [8];
  undefined1 auStack_410 [184];
  Maybe<capnp::Type> local_358;
  StructBuilder local_340;
  StructReader local_318;
  ListReader local_2e8;
  undefined1 local_2b8 [136];
  void *local_230;
  Wrapper *local_228;
  MallocMessageBuilder local_120;
  
  lVar9 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  local_2b8._0_8_ = (lVar9 >> 3) * 0x6db6db6db6db6db7;
  local_2b8._8_4_ = 1;
  local_2b8._16_8_ = " == ";
  local_2b8._24_8_ = 5;
  local_2b8[0x20] = lVar9 == 0x38;
  if (!local_2b8[0x20]) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4b0,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_2b8);
    kj::_::Debug::Fault::fatal((Fault *)&local_120);
  }
  local_568._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__0027a9a0;
  local_560 = false;
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_508,&local_120.super_MessageBuilder);
  local_2b8._16_8_ = CStack_500.decl.mutex;
  local_2b8._8_8_ = CStack_500.compiler;
  capnp::_::PointerBuilder::initStruct(&local_340,(PointerBuilder *)local_2b8,(StructSize)0x10000);
  sVar14 = input.content.size_ - 1;
  result._builder.capTable = local_340.capTable;
  result._builder.segment = local_340.segment;
  result._builder.data = local_340.data;
  result._builder.pointers = local_340.pointers;
  result._builder.dataSize = local_340.dataSize;
  result._builder.pointerCount = local_340.pointerCount;
  result._builder._38_2_ = local_340._38_2_;
  input_00.size_ = sVar14;
  input_00.ptr = input.content.ptr;
  lex(input_00,result,&local_568);
  orphanageParam = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  CapnpParser::CapnpParser((CapnpParser *)local_2b8,orphanageParam,&local_568);
  capnp::_::StructBuilder::asReader(&local_340);
  bVar15 = CStack_500.decl.value.body.field_1._4_2_ == 0;
  auStack_410._8_8_ =
       (SegmentBuilder *)CONCAT44(CStack_500.decl.value.body._4_4_,CStack_500.decl.value.body.tag);
  if (bVar15) {
    auStack_410._8_8_ = (SegmentBuilder *)0x0;
  }
  auStack_410._16_4_ = 0x7fffffff;
  if (!bVar15) {
    auStack_410._16_4_ = CStack_500.decl.value.body.field_1._8_4_;
  }
  local_418[0] = false;
  local_418._1_3_ = 0;
  local_418._4_4_ = 0;
  auStack_410._0_4_ = 0;
  auStack_410._4_4_ = 0;
  if (!bVar15) {
    local_418._0_4_ = local_508._0_4_;
    local_418._4_4_ = local_508._4_4_;
    auStack_410._0_4_ = CStack_500.compiler._0_4_;
    auStack_410._4_4_ = CStack_500.compiler._4_4_;
  }
  capnp::_::PointerReader::getList
            (&local_2e8,(PointerReader *)local_418,INLINE_COMPOSITE,(word *)0x0);
  local_540 = 0;
  local_530 = 0;
  local_520 = local_2e8.elementCount;
  local_510 = 0;
  local_538 = &local_2e8;
  local_528 = &local_2e8;
  local_518 = &local_2e8;
  if (local_2e8.elementCount == 0) {
    message.content.size_ = 0x1a;
    message.content.ptr = "Couldn\'t parse type name.";
    setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj::
    StringPtr_(&local_568,0,0,message);
  }
  else {
    (*(code *)**(undefined8 **)local_228)(local_508,local_228,local_230);
    local_440 = local_508[0];
    if ((bool)local_508[0] == true) {
      local_438.segment = (SegmentBuilder *)CStack_500.decl.mutex;
      local_438.location = (word *)CStack_500.decl.value.body.field_1._0_8_;
      local_438.tag.content = (uint64_t)CStack_500.compiler;
      if (local_530 != local_2e8.elementCount) {
        capnp::_::ListReader::getStructElement((StructReader *)local_508,local_538,local_530);
        uVar12 = 0;
        if ((uint)CStack_500.decl.value.body.field_1._0_4_ < 0x40) {
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)*(uint *)((long)&((SegmentReader *)&(CStack_500.decl.mutex)->futex)->arena
                                   + 4);
          if (0x9f < (uint)CStack_500.decl.value.body.field_1._0_4_) {
            uVar12 = (ulong)*(uint *)&(((SegmentReader *)&(CStack_500.decl.mutex)->futex)->ptr).ptr;
          }
        }
        (**local_568._vptr_ErrorReporter)
                  (&local_568,uVar13,uVar12,"Couldn\'t parse type name.",0x1a);
        goto LAB_0011db21;
      }
      pSVar2 = (this->sourceFiles).builder.ptr;
      capnp::_::OrphanBuilder::asStructReader(&local_318,&local_438,(StructSize)0x20003);
      expression._reader.capTable = local_318.capTable;
      expression._reader.segment = local_318.segment;
      expression._reader.data = local_318.data;
      expression._reader.pointers = local_318.pointers;
      expression._reader.dataSize = local_318.dataSize;
      expression._reader.pointerCount = local_318.pointerCount;
      expression._reader._38_2_ = local_318._38_2_;
      expression._reader.nestingLimit = local_318.nestingLimit;
      expression._reader._44_4_ = local_318._44_4_;
      Compiler::ModuleScope::evalType
                ((Maybe<capnp::compiler::Compiler::CompiledType> *)local_418,&pSVar2->compiled,
                 expression,&local_568);
      local_508[0] = local_418[0];
      bVar8 = local_418[0];
      if ((bool)local_418[0] == true) {
        CStack_500.compiler = (Compiler *)auStack_410._0_8_;
        CStack_500.decl.mutex = (Mutex *)auStack_410._8_8_;
        CStack_500.decl.value.body.tag = auStack_410._16_4_;
        if (auStack_410._16_4_ == 2) {
          CStack_500.decl.value.body.field_1._0_8_ = auStack_410._24_8_;
          CStack_500.decl.value.body.field_1._8_8_ = auStack_410._32_8_;
        }
        else if (auStack_410._16_4_ == 1) {
          CStack_500.decl.value.body.field_1._32_8_ = auStack_410._56_8_;
          CStack_500.decl.value.body.field_1._16_8_ = auStack_410._40_8_;
          CStack_500.decl.value.body.field_1._24_8_ = auStack_410._48_8_;
          CStack_500.decl.value.body.field_1._0_8_ = auStack_410._24_8_;
          CStack_500.decl.value.body.field_1._8_8_ = auStack_410._32_8_;
          CStack_500.decl.value.body.field_1.space[0x28] = auStack_410[0x40];
          if (auStack_410[0x40] == '\x01') {
            CStack_500.decl.value.body.field_1._80_8_ = auStack_410._104_8_;
            CStack_500.decl.value.body.field_1._88_8_ = auStack_410._112_8_;
            CStack_500.decl.value.body.field_1._64_8_ = auStack_410._88_8_;
            CStack_500.decl.value.body.field_1._72_8_ = auStack_410._96_8_;
            CStack_500.decl.value.body.field_1._48_8_ = auStack_410._72_8_;
            CStack_500.decl.value.body.field_1._56_8_ = auStack_410._80_8_;
            auStack_410[0x40] = '\0';
          }
        }
        CStack_500.decl.value.brand.disposer = (Disposer *)auStack_410._120_8_;
        CStack_500.decl.value.brand.ptr = (BrandScope *)auStack_410._128_8_;
        auStack_410._128_8_ = (BrandScope *)0x0;
        CStack_500.decl.value.source._reader.segment = (SegmentReader *)auStack_410._136_8_;
        CStack_500.decl.value.source._reader.capTable = (CapTableReader *)auStack_410._144_8_;
        CStack_500.decl.value.source._reader.data = (void *)auStack_410._152_8_;
        CStack_500.decl.value.source._reader.pointers = (WirePointer *)auStack_410._160_8_;
        CStack_500.decl.value.source._reader.dataSize = auStack_410._168_4_;
        CStack_500.decl.value.source._reader.pointerCount = auStack_410._172_2_;
        CStack_500.decl.value.source._reader._38_2_ = auStack_410._174_2_;
        CStack_500.decl.value.source._reader._40_8_ = auStack_410._176_8_;
        auStack_410._8_8_ = (SegmentBuilder *)0x0;
        kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
                  ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)(auStack_410 + 8));
        bVar8 = local_508[0];
      }
      if ((bVar8 & 1) == 0) {
        bVar15 = false;
      }
      else {
        Compiler::CompiledType::getSchema(&local_358,&CStack_500);
        local_418[0] = local_358.ptr.isSet;
        if (local_358.ptr.isSet == true) {
          auStack_410._0_8_ = local_358.ptr.field_1._0_8_;
          uVar7 = auStack_410._0_8_;
          auStack_410._8_8_ = local_358.ptr.field_1.value.field_4;
          auStack_410._0_2_ = (undefined2)local_358.ptr.field_1._0_8_;
          auStack_410._0_8_ = uVar7;
          if ((auStack_410._0_2_ == 0x10) &&
             (auStack_410[2] = (undefined1)((ulong)local_358.ptr.field_1._0_8_ >> 0x10),
             auStack_410[2] == '\0')) {
            SVar10 = Type::asStruct((Type *)auStack_410);
            (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar10.super_Schema.raw;
            bVar15 = true;
          }
          else {
            bVar15 = false;
            message_02.content.size_ = 0x16;
            message_02.content.ptr = "Type is not a struct.";
            setRootType(kj::StringPtr)::CliArgumentErrorReporter::
            addError(unsigned_int,unsigned_int,kj::StringPtr_(&local_568,0,0,message_02);
          }
        }
        else {
          bVar15 = false;
          message_01.content.size_ = 0x16;
          message_01.content.ptr = "Type is not a struct.";
          setRootType(kj::StringPtr)::CliArgumentErrorReporter::
          addError(unsigned_int,unsigned_int,kj::StringPtr_(&local_568,0,0,message_01);
        }
        bVar8 = local_508[0];
      }
      if ((bVar8 & 1) != 0) {
        kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
                  (&CStack_500.decl);
      }
    }
    else {
      index = local_510;
      if (local_510 < local_530) {
        index = local_530;
      }
      if (index == local_2e8.elementCount) {
        startByte = (uint32_t)sVar14;
        message_00.content.size_ = 0x1a;
        message_00.content.ptr = "Couldn\'t parse type name.";
        setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj
        ::StringPtr_(&local_568,startByte,startByte,message_00);
      }
      else {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)local_508,(&local_538)[(ulong)(local_530 <= local_510) * 4],index
                  );
        uVar12 = 0;
        if ((uint)CStack_500.decl.value.body.field_1._0_4_ < 0x40) {
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)*(uint *)((long)&((SegmentReader *)&(CStack_500.decl.mutex)->futex)->arena
                                   + 4);
          if (0x9f < (uint)CStack_500.decl.value.body.field_1._0_4_) {
            uVar12 = (ulong)*(uint *)&(((SegmentReader *)&(CStack_500.decl.mutex)->futex)->ptr).ptr;
          }
        }
        (**local_568._vptr_ErrorReporter)
                  (&local_568,uVar13,uVar12,"Couldn\'t parse type name.",0x1a);
      }
LAB_0011db21:
      bVar15 = false;
    }
    if ((local_440 == '\x01') && (local_438.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_438);
    }
    if (bVar15) goto LAB_0011db5f;
  }
  local_418[0] = local_560;
  if (local_560 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              ((Fault *)local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4fd,FAILED,"success || errorReporter.hadErrors()","_kjCondition,",
               (bool *)local_418);
    kj::_::Debug::Fault::fatal((Fault *)local_508);
  }
LAB_0011db5f:
  bVar15 = (local_560 & 1U) != 0;
  if (bVar15) {
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_558;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = sStack_550;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_548;
    local_558 = (char *)0x0;
    sStack_550 = 0;
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = bVar15;
  if (local_540 != 0) {
    uVar3 = local_510;
    ppLVar5 = &local_518;
    if (local_510 < local_530) {
      uVar3 = local_530;
      ppLVar5 = &local_538;
    }
    uVar1 = *(uint *)(local_540 + 0x30);
    uVar4 = uVar3;
    if (uVar3 <= uVar1) {
      uVar4 = uVar1;
    }
    ppLVar11 = (ListReader **)(local_540 + 0x28);
    if (uVar1 < uVar3) {
      ppLVar11 = ppLVar5;
    }
    *(ListReader **)(local_540 + 0x28) = *ppLVar11;
    *(uint *)(local_540 + 0x30) = uVar4;
  }
  CapnpParser::~CapnpParser((CapnpParser *)local_2b8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  sVar14 = sStack_550;
  pcVar6 = local_558;
  local_568._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__0027a9a0;
  if ((local_560 == true) && (local_558 != (char *)0x0)) {
    local_558 = (char *)0x0;
    sStack_550 = 0;
    (**local_548->_vptr_ArrayDisposer)(local_548,pcVar6,1,sVar14,sVar14,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr input) {
    KJ_ASSERT(sourceFiles.size() == 1);

    class CliArgumentErrorReporter: public ErrorReporter {
    public:
      void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }

      bool hadErrors() override {
        return error != kj::none;
      }

      kj::MainBuilder::Validity getValidity() {
        KJ_IF_SOME(e, error) {
          return kj::mv(e);
        } else {
          return true;
        }
      }

    private:
      kj::Maybe<kj::String> error;
    };

    CliArgumentErrorReporter errorReporter;

    capnp::MallocMessageBuilder tokenArena;
    auto lexedTokens = tokenArena.initRoot<capnp::compiler::LexedTokens>();
    lex(input, lexedTokens, errorReporter);

    CapnpParser parser(tokenArena.getOrphanage(), errorReporter);
    auto tokens = lexedTokens.asReader().getTokens();
    CapnpParser::ParserInput parserInput(tokens.begin(), tokens.end());

    bool success = false;

    if (parserInput.getPosition() == tokens.end()) {
      // Empty argument?
      errorReporter.addError(0, 0, "Couldn't parse type name.");
    } else {
      KJ_IF_SOME(expression, parser.getParsers().expression(parserInput)) {
        // The input is expected to contain a *single* expression.
        if (parserInput.getPosition() == tokens.end()) {
          // Hooray, now parse it.
          KJ_IF_SOME(compiledType,
              sourceFiles[0].compiled.evalType(expression.getReader(), errorReporter)) {
            KJ_IF_SOME(type, compiledType.getSchema()) {
              if (type.isStruct()) {
                rootType = type.asStruct();
                success = true;
              } else {
                errorReporter.addError(0, 0, "Type is not a struct.");
              }
            } else {
              // Apparently named a file scope.
              errorReporter.addError(0, 0, "Type is not a struct.");
            }
          }
        } else {
          errorReporter.addErrorOn(parserInput.current(), "Couldn't parse type name.");
        }
      }